

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-sp3.c
# Opt level: O0

int read_file(coda_cdf_product *product_file)

{
  int iVar1;
  bool local_35;
  uint local_30;
  uint local_2c;
  int32_t flags;
  int32_t encoding;
  int64_t gdr_offset;
  coda_cdf_product *pcStack_18;
  int32_t record_type;
  coda_cdf_product *product_file_local;
  
  pcStack_18 = product_file;
  iVar1 = read_bytes(product_file->raw_product,0x10,4,(void *)((long)&gdr_offset + 4));
  if (iVar1 < 0) {
    return -1;
  }
  swap4((void *)((long)&gdr_offset + 4));
  if (gdr_offset._4_4_ != 1) {
    coda_set_error(-300,"CDF file has invalid record type (%d) for CDR record",
                   (ulong)gdr_offset._4_4_);
    return -1;
  }
  iVar1 = read_bytes(pcStack_18->raw_product,0x14,8,&flags);
  if (iVar1 < 0) {
    return -1;
  }
  iVar1 = read_bytes(pcStack_18->raw_product,0x1c,4,&pcStack_18->cdf_version);
  if (iVar1 < 0) {
    return -1;
  }
  iVar1 = read_bytes(pcStack_18->raw_product,0x20,4,&pcStack_18->cdf_release);
  if (iVar1 < 0) {
    return -1;
  }
  iVar1 = read_bytes(pcStack_18->raw_product,0x24,4,&local_2c);
  if (iVar1 < 0) {
    return -1;
  }
  iVar1 = read_bytes(pcStack_18->raw_product,0x28,4,&local_30);
  if (iVar1 < 0) {
    return -1;
  }
  iVar1 = read_bytes(pcStack_18->raw_product,0x34,4,&pcStack_18->cdf_increment);
  if (iVar1 < 0) {
    return -1;
  }
  swap8(&flags);
  swap4(&pcStack_18->cdf_version);
  swap4(&pcStack_18->cdf_release);
  swap4(&local_2c);
  swap4(&local_30);
  swap4(&pcStack_18->cdf_increment);
  if ((_flags < 0) || (pcStack_18->file_size <= _flags)) {
    coda_set_error(-300,"CDF file has invalid offset for GDR record");
    return -1;
  }
  if (local_2c - 1 < 2) goto LAB_0016f9bc;
  if (local_2c == 3) {
LAB_0016f9d6:
    coda_set_error(-200,
                   "CDF file contains unsupported floating point format (only IEEE 754 floating point format is supported)"
                  );
    return -1;
  }
  if (local_2c != 4) {
    if (local_2c == 5) {
LAB_0016f9bc:
      pcStack_18->endianness = coda_big_endian;
      goto LAB_0016fa17;
    }
    if (local_2c != 6) {
      if (((local_2c == 7) || (local_2c == 9)) || (local_2c - 0xb < 2)) goto LAB_0016f9bc;
      if (local_2c != 0xd) {
        if (local_2c - 0xe < 2) goto LAB_0016f9d6;
        if (local_2c != 0x10) {
          coda_set_error(-200,"CDF file has unsupported encoding %d",(ulong)local_2c);
          return -1;
        }
      }
    }
  }
  pcStack_18->endianness = coda_little_endian;
LAB_0016fa17:
  if ((local_30 & 1) == 0) {
    pcStack_18->array_ordering = coda_array_ordering_fortran;
  }
  else {
    pcStack_18->array_ordering = coda_array_ordering_c;
  }
  if ((local_30 & 2) == 0) {
    coda_set_error(-200,"multi-file CDF is not supported");
    product_file_local._4_4_ = -1;
  }
  else {
    local_35 = (local_30 & 4) != 0 && (local_30 & 8) != 0;
    pcStack_18->has_md5_chksum = (uint)local_35;
    iVar1 = read_GDR(pcStack_18,_flags);
    if (iVar1 == 0) {
      product_file_local._4_4_ = 0;
    }
    else {
      product_file_local._4_4_ = -1;
    }
  }
  return product_file_local._4_4_;
}

Assistant:

static int read_file(coda_product *product)
{
    coda_mem_record *root_type = NULL;
    ingest_info info;

    ingest_info_init(&info);
    info.product = product;

    info.f = fopen(product->filename, "r");
    if (info.f == NULL)
    {
        coda_set_error(CODA_ERROR_FILE_OPEN, "could not open file %s", product->filename);
        return -1;
    }

    info.header = coda_mem_record_new((coda_type_record *)sp3_type[sp3_header], NULL);
    info.records = coda_mem_array_new((coda_type_array *)sp3_type[sp3_records], NULL);

    if (read_header(&info) != 0)
    {
        ingest_info_cleanup(&info);
        return -1;
    }

    if (read_records(&info) != 0)
    {
        ingest_info_cleanup(&info);
        return -1;
    }

    /* create root record */
    root_type = coda_mem_record_new((coda_type_record *)sp3_type[sp3_file], NULL);
    coda_mem_record_add_field(root_type, "header", (coda_dynamic_type *)info.header, 0);
    info.header = NULL;
    coda_mem_record_add_field(root_type, "record", (coda_dynamic_type *)info.records, 0);
    info.records = NULL;

    product->root_type = (coda_dynamic_type *)root_type;

    ingest_info_cleanup(&info);

    return 0;
}